

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O0

bool __thiscall Jinx::Impl::Parser::Expect(Parser *this,SymbolType symbol,char *errMsg)

{
  bool bVar1;
  char *local_30;
  char *local_28;
  char *errMsg_local;
  Parser *pPStack_18;
  SymbolType symbol_local;
  Parser *this_local;
  
  local_28 = errMsg;
  errMsg_local._4_4_ = symbol;
  pPStack_18 = this;
  bVar1 = Accept(this,symbol);
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else {
    if (local_28 == (char *)0x0) {
      local_30 = GetSymbolTypeText(errMsg_local._4_4_);
      Error<char_const*>(this,"Expected symbol %s",&local_30);
    }
    else {
      Error<char_const*&>(this,"%s",&local_28);
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

inline_t bool Parser::Expect(SymbolType symbol, const char * errMsg)
	{
		if (Accept(symbol))
			return true;
		if (errMsg)
			Error("%s", errMsg);
		else
			Error("Expected symbol %s", GetSymbolTypeText(symbol));
		return false;
	}